

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError ValidateOpenStreamParameters
                  (PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate,unsigned_long framesPerBuffer,PaStreamFlags streamFlags,
                  PaStreamCallback *streamCallback,PaUtilHostApiRepresentation **hostApi,
                  PaDeviceIndex *hostApiInputDevice,PaDeviceIndex *hostApiOutputDevice)

{
  int iVar1;
  ulong in_RCX;
  long in_RDX;
  int *in_RSI;
  int *in_RDI;
  long in_R8;
  long *in_R9;
  double in_XMM0_Qa;
  int outputHostApiIndex;
  int inputHostApiIndex;
  int local_48;
  int local_44;
  PaError local_4;
  
  local_44 = -1;
  local_48 = -1;
  if ((in_RDI == (int *)0x0) && (in_RSI == (int *)0x0)) {
    return -0x270c;
  }
  if (in_RDI == (int *)0x0) {
    *(undefined4 *)hostApi = 0xffffffff;
  }
  else if (*in_RDI == -2) {
    if (*(long *)(in_RDI + 6) == 0) {
      return -0x270c;
    }
    local_44 = Pa_HostApiTypeIdToHostApiIndex(*(PaHostApiTypeId *)(*(long *)(in_RDI + 6) + 8));
    if (local_44 == -1) {
      return -0x270c;
    }
    *(undefined4 *)hostApi = 0xfffffffe;
    *in_R9 = (long)hostApis_[local_44];
  }
  else {
    if ((*in_RDI < 0) || (deviceCount_ <= *in_RDI)) {
      return -0x270c;
    }
    local_44 = FindHostApi(*in_RDI,(int *)hostApi);
    if (local_44 < 0) {
      return -0x2702;
    }
    *in_R9 = (long)hostApis_[local_44];
    if (in_RDI[1] < 1) {
      return -0x270e;
    }
    iVar1 = SampleFormatIsValid(*(PaSampleFormat *)(in_RDI + 2));
    if (iVar1 == 0) {
      return -0x270a;
    }
    if ((*(long *)(in_RDI + 6) != 0) &&
       (*(int *)(*(long *)(in_RDI + 6) + 8) != *(int *)(*in_R9 + 0xc))) {
      return -0x2700;
    }
  }
  if (in_RSI == (int *)0x0) {
    *(undefined4 *)streamCallback = 0xffffffff;
  }
  else if (*in_RSI == -2) {
    if (*(long *)(in_RSI + 6) == 0) {
      return -0x270c;
    }
    local_48 = Pa_HostApiTypeIdToHostApiIndex(*(PaHostApiTypeId *)(*(long *)(in_RSI + 6) + 8));
    if (local_48 == -1) {
      return -0x270c;
    }
    *(undefined4 *)streamCallback = 0xfffffffe;
    *in_R9 = (long)hostApis_[local_48];
  }
  else {
    if ((*in_RSI < 0) || (deviceCount_ <= *in_RSI)) {
      return -0x270c;
    }
    local_48 = FindHostApi(*in_RSI,(int *)streamCallback);
    if (local_48 < 0) {
      return -0x2702;
    }
    *in_R9 = (long)hostApis_[local_48];
    if (in_RSI[1] < 1) {
      return -0x270e;
    }
    iVar1 = SampleFormatIsValid(*(PaSampleFormat *)(in_RSI + 2));
    if (iVar1 == 0) {
      return -0x270a;
    }
    if ((*(long *)(in_RSI + 6) != 0) &&
       (*(int *)(*(long *)(in_RSI + 6) + 8) != *(int *)(*in_R9 + 0xc))) {
      return -0x2700;
    }
  }
  if (((in_RDI == (int *)0x0) || (in_RSI == (int *)0x0)) || (local_44 == local_48)) {
    if ((in_XMM0_Qa < 1000.0) || (384000.0 < in_XMM0_Qa)) {
      local_4 = -0x270d;
    }
    else if ((in_RCX & 0xffffffff0000fff0) == 0) {
      if ((in_RCX & 4) != 0) {
        if (in_R8 == 0) {
          return -0x270b;
        }
        if ((in_RDI == (int *)0x0) || (in_RSI == (int *)0x0)) {
          return -0x270b;
        }
        if (in_RDX != 0) {
          return -0x270b;
        }
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x270b;
    }
  }
  else {
    local_4 = -0x2709;
  }
  return local_4;
}

Assistant:

static PaError ValidateOpenStreamParameters(
    const PaStreamParameters *inputParameters,
    const PaStreamParameters *outputParameters,
    double sampleRate,
    unsigned long framesPerBuffer,
    PaStreamFlags streamFlags,
    PaStreamCallback *streamCallback,
    PaUtilHostApiRepresentation **hostApi,
    PaDeviceIndex *hostApiInputDevice,
    PaDeviceIndex *hostApiOutputDevice )
{
    int inputHostApiIndex  = -1, /* Surpress uninitialised var warnings: compiler does */
        outputHostApiIndex = -1; /* not see that if inputParameters and outputParame-  */
                                 /* ters are both nonzero, these indices are set.      */

    if( (inputParameters == NULL) && (outputParameters == NULL) )
    {
        return paInvalidDevice; /** @todo should be a new error code "invalid device parameters" or something */
    }
    else
    {
        if( inputParameters == NULL )
        {
            *hostApiInputDevice = paNoDevice;
        }
        else if( inputParameters->device == paUseHostApiSpecificDeviceSpecification )
        {
            if( inputParameters->hostApiSpecificStreamInfo )
            {
                inputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( inputHostApiIndex != -1 )
                {
                    *hostApiInputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[inputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( inputParameters->device < 0 || inputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            inputHostApiIndex = FindHostApi( inputParameters->device, hostApiInputDevice );
            if( inputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[inputHostApiIndex];

            if( inputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( inputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( inputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)inputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( outputParameters == NULL )
        {
            *hostApiOutputDevice = paNoDevice;
        }
        else if( outputParameters->device == paUseHostApiSpecificDeviceSpecification  )
        {
            if( outputParameters->hostApiSpecificStreamInfo )
            {
                outputHostApiIndex = Pa_HostApiTypeIdToHostApiIndex(
                        ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType );

                if( outputHostApiIndex != -1 )
                {
                    *hostApiOutputDevice = paUseHostApiSpecificDeviceSpecification;
                    *hostApi = hostApis_[outputHostApiIndex];
                }
                else
                {
                    return paInvalidDevice;
                }
            }
            else
            {
                return paInvalidDevice;
            }
        }
        else
        {
            if( outputParameters->device < 0 || outputParameters->device >= deviceCount_ )
                return paInvalidDevice;

            outputHostApiIndex = FindHostApi( outputParameters->device, hostApiOutputDevice );
            if( outputHostApiIndex < 0 )
                return paInternalError;

            *hostApi = hostApis_[outputHostApiIndex];

            if( outputParameters->channelCount <= 0 )
                return paInvalidChannelCount;

            if( !SampleFormatIsValid( outputParameters->sampleFormat ) )
                return paSampleFormatNotSupported;

            if( outputParameters->hostApiSpecificStreamInfo != NULL )
            {
                if( ((PaUtilHostApiSpecificStreamInfoHeader*)outputParameters->hostApiSpecificStreamInfo)->hostApiType
                        != (*hostApi)->info.type )
                    return paIncompatibleHostApiSpecificStreamInfo;
            }
        }

        if( (inputParameters != NULL) && (outputParameters != NULL) )
        {
            /* ensure that both devices use the same API */
            if( inputHostApiIndex != outputHostApiIndex )
                return paBadIODeviceCombination;
        }
    }


    /* Check for absurd sample rates. */
    if( (sampleRate < 1000.0) || (sampleRate > 384000.0) )
        return paInvalidSampleRate;

    if( ((streamFlags & ~paPlatformSpecificFlags) & ~(paClipOff | paDitherOff | paNeverDropInput | paPrimeOutputBuffersUsingStreamCallback ) ) != 0 )
        return paInvalidFlag;

    if( streamFlags & paNeverDropInput )
    {
        /* must be a callback stream */
        if( !streamCallback )
             return paInvalidFlag;

        /* must be a full duplex stream */
        if( (inputParameters == NULL) || (outputParameters == NULL) )
            return paInvalidFlag;

        /* must use paFramesPerBufferUnspecified */
        if( framesPerBuffer != paFramesPerBufferUnspecified )
            return paInvalidFlag;
    }

    return paNoError;
}